

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue::set_allocated_doubles
          (TensorValue *this,TensorValue_RepeatedDoubles *doubles)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  TensorValue_RepeatedDoubles *doubles_local;
  TensorValue *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_value(this);
  if (doubles != (TensorValue_RepeatedDoubles *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::
         InternalHelper<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>::GetOwningArena
                   (doubles);
    message_arena = (Arena *)doubles;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>
                              (message_arena_00,doubles,submessage_arena_00);
    }
    set_has_doubles(this);
    (this->value_).floats_ = (TensorValue_RepeatedFloats *)message_arena;
  }
  return;
}

Assistant:

void TensorValue::set_allocated_doubles(::CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles* doubles) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (doubles) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>::GetOwningArena(doubles);
    if (message_arena != submessage_arena) {
      doubles = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, doubles, submessage_arena);
    }
    set_has_doubles();
    value_.doubles_ = doubles;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.TensorValue.doubles)
}